

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

string * __thiscall
wabt::Decompiler::LocalDecl(string *__return_storage_ptr__,Decompiler *this,string *name,Type t)

{
  string_view name_00;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string struc;
  allocator local_79;
  string_view local_78;
  string local_68 [32];
  string local_48;
  
  LoadStoreTracking::GenTypeDecl(&local_48,&this->lst,name);
  name_00.data_ = (name->_M_dataplus)._M_p;
  name_00.size_ = name->_M_string_length;
  local_78 = VarName(this,name_00);
  if (local_48._M_string_length == 0) {
    pcVar1 = GetDecompTypeName(t);
    std::__cxx11::string::string(local_68,pcVar1,&local_79);
  }
  else {
    std::__cxx11::string::string(local_68,(string *)&local_48);
  }
  cat<wabt::string_view,char[2],std::__cxx11::string>
            (__return_storage_ptr__,(wabt *)&local_78,(string_view *)":",(char (*) [2])local_68,
             in_R8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string LocalDecl(const std::string& name, Type t) {
    auto struc = lst.GenTypeDecl(name);
    return cat(VarName(name), ":",
               struc.empty() ? GetDecompTypeName(t) : struc);
  }